

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KVStringPair.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::KVStringPair::KVStringPair
          (KVStringPair *this,XMLCh *key,XMLCh *value,MemoryManager *manager)

{
  short *psVar1;
  size_t __n;
  int iVar2;
  undefined4 extraout_var;
  XMLCh *__dest;
  long lVar3;
  ulong uVar4;
  undefined4 extraout_var_00;
  
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__KVStringPair_004005b8;
  this->fKeyAllocSize = 0;
  this->fValueAllocSize = 0;
  this->fKey = (XMLCh *)0x0;
  this->fValue = (XMLCh *)0x0;
  this->fMemoryManager = manager;
  lVar3 = 0;
  if (key != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)key + lVar3);
      lVar3 = lVar3 + 2;
    } while (*psVar1 != 0);
    lVar3 = (lVar3 >> 1) + -1;
  }
  uVar4 = 0;
  (*manager->_vptr_MemoryManager[4])(manager,0);
  this->fKey = (XMLCh *)0x0;
  this->fKeyAllocSize = lVar3 + 1;
  __n = lVar3 * 2 + 2;
  iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,__n);
  this->fKey = (XMLCh *)CONCAT44(extraout_var,iVar2);
  memcpy((XMLCh *)CONCAT44(extraout_var,iVar2),key,__n);
  if (value != (XMLCh *)0x0) {
    lVar3 = 0;
    do {
      psVar1 = (short *)((long)value + lVar3);
      lVar3 = lVar3 + 2;
    } while (*psVar1 != 0);
    uVar4 = (lVar3 >> 1) - 1;
  }
  if (uVar4 < this->fValueAllocSize) {
    __dest = this->fValue;
  }
  else {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fValue);
    this->fValue = (XMLCh *)0x0;
    this->fValueAllocSize = uVar4 + 1;
    iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,uVar4 * 2 + 2);
    __dest = (XMLCh *)CONCAT44(extraout_var_00,iVar2);
    this->fValue = __dest;
  }
  memcpy(__dest,value,uVar4 * 2 + 2);
  return;
}

Assistant:

KVStringPair::KVStringPair(const XMLCh* const key,
                           const XMLCh* const value,
                           MemoryManager* const manager)
:fKeyAllocSize(0)
,fValueAllocSize(0)
,fKey(0)
,fValue(0)
,fMemoryManager(manager)
{
   set(key, value);
}